

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIR.h
# Opt level: O3

void __thiscall
OpenMPReductionClause::setUserDefinedIdentifier(OpenMPReductionClause *this,char *_identifier)

{
  allocator<char> local_31;
  long *local_30 [2];
  long local_20 [2];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)local_30,_identifier,&local_31);
  std::__cxx11::string::operator=((string *)&this->user_defined_identifier,(string *)local_30);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  return;
}

Assistant:

void setUserDefinedIdentifier(char* _identifier) { user_defined_identifier = std::string(_identifier); }